

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

int Aig_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped)

{
  int iVar1;
  ulong uVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Aig_Obj_t *pObj_00;
  long lVar8;
  void *pvVar9;
  
  uVar7 = *(ulong *)&pObj->field_0x18;
  uVar2 = uVar7 & 0xffffffff0000003f | (ulong)((uint)uVar7 + 0x40 & 0xffffffc0);
  *(ulong *)&pObj->field_0x18 = uVar2;
  iVar6 = 0;
  if (((uVar7 & 0xffffffc0) == 0) && (uVar5 = (uint)uVar7 & 7, iVar6 = 0, uVar5 != 2)) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar5 != 1) {
      if (uVar5 != 5) {
        __assert_fail("Aig_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                      ,0x35,"int Aig_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      if (vMapped != (Vec_Ptr_t *)0x0) {
        uVar5 = vMapped->nSize;
        if (uVar5 == vMapped->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vMapped->pArray,0x80);
            }
            vMapped->pArray = ppvVar3;
            vMapped->nCap = 0x10;
          }
          else {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(vMapped->pArray,(ulong)uVar5 << 4);
            }
            vMapped->pArray = ppvVar3;
            vMapped->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar3 = vMapped->pArray;
        }
        iVar6 = vMapped->nSize;
        vMapped->nSize = iVar6 + 1;
        ppvVar3[iVar6] = pObj;
        uVar2 = *(ulong *)&pObj->field_0x18;
      }
      if ((uVar2 & 0x20) == 0) {
        uVar2 = uVar2 >> 0x38;
        if (uVar2 != 0) {
          pvVar9 = (pObj->field_5).pData;
          do {
            if ((~*(uint *)((long)pvVar9 + 4) & 0x18000000) == 0) goto LAB_0055e77d;
            pvVar9 = (void *)((long)pvVar9 + 0x18);
            uVar5 = (int)uVar2 - 1;
            uVar2 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
        pvVar9 = (void *)0x0;
LAB_0055e77d:
        uVar7 = (ulong)*(uint *)((long)pvVar9 + 4) & 0xffff;
        iVar6 = (int)p->pSopSizes[uVar7 ^ 0xffff] + (int)p->pSopSizes[uVar7];
        if (0x1fffffff < *(uint *)((long)pvVar9 + 4)) {
          uVar7 = 0;
          do {
            pVVar4 = p->pManAig->vObjs;
            if (pVVar4 == (Vec_Ptr_t *)0x0) {
              pObj_00 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar5 = *(uint *)((long)pvVar9 + uVar7 * 4 + 8);
              if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pObj_00 = (Aig_Obj_t *)pVVar4->pArray[uVar5];
            }
            iVar1 = Aig_ManScanMapping_rec(p,pObj_00,vMapped);
            iVar6 = iVar6 + iVar1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar9 + 4) >> 0x1d);
        }
      }
      else {
        pVVar4 = (Vec_Ptr_t *)malloc(0x10);
        pVVar4->nCap = 100;
        pVVar4->nSize = 0;
        ppvVar3 = (void **)malloc(800);
        pVVar4->pArray = ppvVar3;
        Aig_ObjCollectSuper(pObj,pVVar4);
        iVar6 = pVVar4->nSize + 1;
        if (0 < pVVar4->nSize) {
          lVar8 = 0;
          do {
            iVar1 = Aig_ManScanMapping_rec
                              (p,(Aig_Obj_t *)((ulong)pVVar4->pArray[lVar8] & 0xfffffffffffffffe),
                               vMapped);
            iVar6 = iVar6 + iVar1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar4->nSize);
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
        }
        free(pVVar4);
        pObj->field_0x18 = pObj->field_0x18 | 0x20;
      }
    }
  }
  return iVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area, references, and nodes used in the mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pLeaf;
    Dar_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    // collect the node first to derive pre-order
    if ( vMapped )
        Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = Dar_ObjBestCut( pObj );
        aArea = Cnf_CutSopCost( p, pCutBest );
        Dar_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, pLeaf, vMapped );
    }
    return aArea;
}